

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O0

void __thiscall re2c::CpgotoTable::emit(CpgotoTable *this,OutputFile *o,uint32_t ind)

{
  uint32_t uVar1;
  uint32_t uVar2;
  OutputFile *pOVar3;
  opt_t *poVar4;
  ulong __n;
  allocator<char> local_51;
  string local_50;
  uint local_30;
  uint32_t local_2c;
  uint32_t padding;
  label_t local_24;
  uint32_t i;
  uint32_t local_1c;
  uint32_t max_digits;
  uint32_t ind_local;
  OutputFile *o_local;
  CpgotoTable *this_local;
  
  local_1c = ind;
  _max_digits = o;
  o_local = (OutputFile *)this;
  pOVar3 = OutputFile::wind(o,ind);
  pOVar3 = OutputFile::ws(pOVar3,"static void *");
  poVar4 = Opt::operator->((Opt *)&opts);
  pOVar3 = OutputFile::wstring(pOVar3,&poVar4->yytarget);
  OutputFile::ws(pOVar3,"[256] = {\n");
  local_1c = local_1c + 1;
  OutputFile::wind(_max_digits,local_1c);
  local_24 = max_label(this);
  i = label_t::width(&local_24);
  for (padding = 0; padding < 0x100; padding = padding + 1) {
    pOVar3 = OutputFile::ws(_max_digits,"&&");
    poVar4 = Opt::operator->((Opt *)&opts);
    pOVar3 = OutputFile::wstring(pOVar3,&poVar4->labelPrefix);
    local_2c = (this->table[padding]->label).value;
    OutputFile::wlabel(pOVar3,(label_t)local_2c);
    uVar1 = i;
    if (padding == 0xff) {
      OutputFile::ws(_max_digits,"\n");
    }
    else if ((padding & 7) == 7) {
      pOVar3 = OutputFile::ws(_max_digits,",\n");
      OutputFile::wind(pOVar3,local_1c);
    }
    else {
      uVar2 = label_t::width(&this->table[padding]->label);
      local_30 = (uVar1 - uVar2) + 1;
      pOVar3 = OutputFile::ws(_max_digits,",");
      __n = (ulong)local_30;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__n,' ',&local_51);
      OutputFile::wstring(pOVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
  }
  local_1c = local_1c - 1;
  pOVar3 = OutputFile::wind(_max_digits,local_1c);
  OutputFile::ws(pOVar3,"};\n");
  return;
}

Assistant:

void CpgotoTable::emit (OutputFile & o, uint32_t ind)
{
	o.wind(ind).ws("static void *").wstring(opts->yytarget).ws("[256] = {\n");
	o.wind(++ind);
	const uint32_t max_digits = max_label ().width ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		o.ws("&&").wstring(opts->labelPrefix).wlabel(table[i]->label);
		if (i == TABLE_SIZE - 1)
		{
			o.ws("\n");
		}
		else if (i % 8 == 7)
		{
			o.ws(",\n").wind(ind);
		}
		else
		{
			const uint32_t padding = max_digits - table[i]->label.width () + 1;
			o.ws(",").wstring(std::string (padding, ' '));
		}
	}
	o.wind(--ind).ws("};\n");
}